

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

void __thiscall
iDynTree::InverseKinematics::setLinearSolverName(InverseKinematics *this,string *solverName)

{
  missingIpoptErrorReport();
  return;
}

Assistant:

void InverseKinematics::setLinearSolverName(const std::string &solverName)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        IK_PIMPL(m_pimpl)->m_solverName = solverName;
#else
        missingIpoptErrorReport();
#endif
    }